

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgbx_8888_to_argb_4444
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  short *psVar1;
  ushort uVar2;
  short *psVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  
  if (0 < height) {
    psVar3 = (short *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar4 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar5 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar5 = src_pitch;
    }
    iVar6 = 0;
    do {
      if (0 < width) {
        psVar1 = psVar3 + width;
        do {
          uVar2 = (ushort)(*puVar4 >> 0x10);
          *psVar3 = (uVar2 >> 4 & 0xf00) + (uVar2 & 0xf0 | (ushort)(*puVar4 >> 0xc) & 0xf) + -0x1000
          ;
          psVar3 = psVar3 + 1;
          puVar4 = puVar4 + 1;
        } while (psVar3 < psVar1);
      }
      puVar4 = puVar4 + ((iVar5 >> 2) - width);
      psVar3 = psVar3 + (dst_pitch / 2 - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void rgbx_8888_to_argb_4444(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBX_8888_TO_ARGB_4444(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}